

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::constant_name(string *__return_storage_ptr__,t_dart_generator *this,string *name)

{
  pointer pcVar1;
  size_type sVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  int __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (name->_M_dataplus)._M_p;
  sVar2 = name->_M_string_length;
  bVar3 = 1;
  bVar4 = false;
  for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
    __c = (int)pcVar1[sVar6];
    iVar5 = isupper(__c);
    if (!(bool)(bVar4 | bVar3 | iVar5 == 0)) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    toupper(__c);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    bVar3 = 0;
    bVar4 = iVar5 != 0;
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::constant_name(string name) {
  string constant_name;

  bool is_first = true;
  bool was_previous_char_upper = false;
  for (char character : name) {
    bool is_upper = isupper(character);

    if (is_upper && !is_first && !was_previous_char_upper) {
      constant_name += '_';
    }
    constant_name += toupper(character);

    is_first = false;
    was_previous_char_upper = is_upper;
  }

  return constant_name;
}